

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::Clear
          (TestParsingMergeLite_RepeatedFieldsGenerator *this)

{
  uint32_t cached_has_bits;
  TestParsingMergeLite_RepeatedFieldsGenerator *this_local;
  
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Clear
            (&(this->field_0)._impl_.field1_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Clear
            (&(this->field_0)._impl_.field2_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Clear
            (&(this->field_0)._impl_.field3_);
  google::protobuf::
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::Clear
            (&(this->field_0)._impl_.group1_);
  google::protobuf::
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::Clear
            (&(this->field_0)._impl_.group2_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Clear
            (&(this->field_0)._impl_.ext1_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::Clear
            (&(this->field_0)._impl_.ext2_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestParsingMergeLite_RepeatedFieldsGenerator::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.field1_.Clear();
  _impl_.field2_.Clear();
  _impl_.field3_.Clear();
  _impl_.group1_.Clear();
  _impl_.group2_.Clear();
  _impl_.ext1_.Clear();
  _impl_.ext2_.Clear();
  _internal_metadata_.Clear<std::string>();
}